

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitCommon.c
# Opt level: O3

void sysbvm_bytecodeJit_refSlotAtPut
               (sysbvm_context_t *context,sysbvm_tuple_t tupleReference,sysbvm_tuple_t typeSlot,
               sysbvm_tuple_t value)

{
  ulong uVar1;
  sysbvm_tuple_t tuple;
  size_t slotIndex;
  
  if ((typeSlot & 0xf) == 0 && typeSlot != 0) {
    uVar1 = *(ulong *)(typeSlot + 0x48);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      slotIndex = (long)uVar1 >> 4;
    }
    else {
      slotIndex = *(size_t *)(uVar1 + 0x10);
    }
  }
  else {
    slotIndex = 0;
  }
  tuple = sysbvm_pointerLikeType_load(context,tupleReference);
  sysbvm_tuple_slotAtPut(context,tuple,slotIndex,value);
  return;
}

Assistant:

SYSBVM_API void sysbvm_bytecodeJit_refSlotAtPut(sysbvm_context_t *context, sysbvm_tuple_t tupleReference, sysbvm_tuple_t typeSlot, sysbvm_tuple_t value)
{
    size_t slotIndex = sysbvm_typeSlot_getIndex(typeSlot);
    sysbvm_tuple_slotAtPut(context, sysbvm_pointerLikeType_load(context, tupleReference), slotIndex, value);
}